

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O2

error_or<int> *
pstore::file::file_handle::close_noex(error_or<int> *__return_storage_ptr__,oshandle file)

{
  int iVar1;
  int *piVar2;
  error_code eVar3;
  error_code erc;
  
  if ((file != -1) && (iVar1 = ::close(file), iVar1 == -1)) {
    piVar2 = __errno_location();
    eVar3 = make_error_code((errno_erc)*piVar2);
    erc._M_cat = eVar3._M_cat;
    erc._4_4_ = 0;
    erc._M_value = eVar3._M_value;
    error_or<int>::error_or(__return_storage_ptr__,erc);
    return __return_storage_ptr__;
  }
  error_or<int>::error_or<int_const&>(__return_storage_ptr__,&invalid_oshandle);
  return __return_storage_ptr__;
}

Assistant:

auto file_handle::close_noex (oshandle const file) -> error_or<oshandle> {
            if (file != invalid_oshandle && ::close (file) == -1) {
                return error_or<oshandle>{make_error_code (pstore::errno_erc (errno))};
            }
            return error_or<oshandle>{in_place, invalid_oshandle};
        }